

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O0

int dfsplain_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pOldPred;
  Abc_Obj_t *pNext;
  int i;
  Abc_Obj_t *pPred_local;
  Abc_Obj_t *pObj_local;
  
  iVar3 = Abc_ObjIsLatch(pObj);
  if (((iVar3 != 0) || ((pManMR->fIsForward != 0 && (iVar3 = Abc_ObjIsPo(pObj), iVar3 != 0)))) ||
     ((pManMR->fIsForward != 0 &&
      (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pObj),
      (*(ushort *)(pFVar1 + uVar4) & 0x90 & pManMR->constraintMask) != 0)))) {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                    ,0x271,"int dfsplain_r(Abc_Obj_t *, Abc_Obj_t *)");
    }
    return 1;
  }
  pFVar1 = pManMR->pDataArray;
  uVar4 = Abc_ObjId(pObj);
  *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) | 2;
  pFVar1 = pManMR->pDataArray;
  uVar4 = Abc_ObjId(pObj);
  if ((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    pFVar1 = pManMR->pDataArray;
    uVar4 = Abc_ObjId(pObj);
    if (((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x1) !=
         (undefined1  [24])0x0) || (iVar3 = dfsplain_e(pObj,pObj), iVar3 == 0)) goto LAB_005e955f;
    pFVar1 = pManMR->pDataArray;
    uVar4 = Abc_ObjId(pObj);
    *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) | 4;
    FSETPRED(pObj,pPred);
  }
  else {
    pAVar5 = FGETPRED(pObj);
    if (((pAVar5 == (Abc_Obj_t *)0x0) ||
        (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
        (undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x1) !=
        (undefined1  [24])0x0)) || (iVar3 = dfsplain_e(pAVar5,pAVar5), iVar3 == 0)) {
LAB_005e955f:
      if (pManMR->fIsForward != 0) {
        for (pNext._4_4_ = 0; iVar3 = Abc_ObjFaninNum(pObj), pNext._4_4_ < iVar3;
            pNext._4_4_ = pNext._4_4_ + 1) {
          pAVar5 = Abc_ObjFanin(pObj,pNext._4_4_);
          pFVar1 = pManMR->pDataArray;
          uVar4 = Abc_ObjId(pAVar5);
          if ((((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x2) ==
                (undefined1  [24])0x0) && (iVar3 = Abc_ObjIsLatch(pAVar5), iVar3 == 0)) &&
             (iVar3 = dfsplain_r(pAVar5,pPred), iVar3 != 0)) {
            return 1;
          }
        }
        if (pManMR->maxDelay != 0) {
          pNext._4_4_ = 0;
          while( true ) {
            pVVar2 = pManMR->vTimeEdges;
            uVar4 = Abc_ObjId(pObj);
            iVar3 = Vec_PtrSize(pVVar2 + uVar4);
            if (iVar3 <= pNext._4_4_) break;
            pVVar2 = pManMR->vTimeEdges;
            uVar4 = Abc_ObjId(pObj);
            pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2 + uVar4,pNext._4_4_);
            pFVar1 = pManMR->pDataArray;
            uVar4 = Abc_ObjId(pAVar5);
            if (((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x2) ==
                 (undefined1  [24])0x0) && (iVar3 = dfsplain_r(pAVar5,pPred), iVar3 != 0)) {
              return 1;
            }
            pNext._4_4_ = pNext._4_4_ + 1;
          }
        }
      }
      return 0;
    }
    FSETPRED(pObj,pPred);
  }
  return 1;
}

Assistant:

int dfsplain_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) || 
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  // printf(" %dr\n", Abc_ObjId(pObj));

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        dfsplain_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        dfsplain_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. follow reverse edges
  if (pManMR->fIsForward) { // forward retiming only
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  return 1;
}